

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

char * end_of_printed_string(char *src)

{
  char cVar1;
  char **src_00;
  long in_RDI;
  _Bool cont;
  _Bool escaped;
  uint in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffec;
  bool bVar2;
  char in_stack_ffffffffffffffee;
  byte bVar3;
  char *local_8;
  
  bVar3 = 0;
  src_00 = (char **)(in_RDI + 1);
  do {
    while( true ) {
      bVar2 = false;
      if ((*(char *)src_00 != '\0') &&
         (in_stack_ffffffffffffffec = true, bVar2 = (bool)in_stack_ffffffffffffffec,
         (bVar3 & 1) == 0)) {
        in_stack_ffffffffffffffec = *(char *)src_00 != '\"';
        bVar2 = (bool)in_stack_ffffffffffffffec;
      }
      if (bVar2 == false) break;
      if (((bVar3 & 1) != 0) && (cVar1 = get_escaped_char(*(char *)src_00,0), cVar1 == '\0')) {
        return (char *)0x0;
      }
      if (*(char *)src_00 == '\\') {
        in_stack_ffffffffffffffe8 = (uint)((bVar3 ^ 0xff) & 1);
      }
      else {
        in_stack_ffffffffffffffe8 = 0;
      }
      bVar3 = in_stack_ffffffffffffffe8 != 0;
      src_00 = (char **)((long)src_00 + 1);
    }
    if ((*(char *)src_00 == '\"') && (*(char *)((long)src_00 + 1) == '\\')) {
      skip_fmt_null(src_00,(char *)CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffffee,
                                                           (uint6)CONCAT14(in_stack_ffffffffffffffec
                                                                           ,
                                                  in_stack_ffffffffffffffe8))));
      in_stack_ffffffffffffffee = '\x01';
    }
    else {
      in_stack_ffffffffffffffee = '\0';
    }
  } while (in_stack_ffffffffffffffee != '\0');
  if ((src_00 == (char **)0x0) || (*(char *)src_00 == '\0')) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = (char *)((long)src_00 + 1);
  }
  return local_8;
}

Assistant:

static const char* end_of_printed_string(const char* src)
{
    bool escaped = false;
    ++src;
    bool cont;
    do
    {
        for(; *src && (escaped || *src != '"') ; ++src)
        {
            if(escaped) // last char introduced an escape sequence?
            {
                if(!get_escaped_char(*src, false))
                    return NULL; // bad escape sequence
            }
            escaped = (*src == '\\') ? (!escaped) : false;
        }
        if(*src == '"' && src[1] == '\\') {
            skip_fmt_null(&src, "\"\\ \"%n");
            cont = true;
        }
        else
            cont = false;
    } while(cont);
    if(!src || !*src)
        return NULL;
    return ++src;
}